

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * Lowerer::LoadGeneratorObject(Instr *instrInsert)

{
  Func *this;
  uint16 uVar1;
  StackSym *stackSym;
  SymOpnd *src;
  RegOpnd *dst;
  Instr *pIVar2;
  RegOpnd *generatorRegOpnd;
  SymOpnd *generatorSymOpnd;
  StackSym *generatorSym;
  Instr *instrInsert_local;
  
  stackSym = StackSym::NewImplicitParamSym(3,instrInsert->m_func);
  this = instrInsert->m_func;
  uVar1 = LowererMD::GetFormalParamOffset();
  Func::SetArgOffset(this,stackSym,(uint)uVar1 << 3);
  src = IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,instrInsert->m_func);
  dst = IR::RegOpnd::New(TyUint64,instrInsert->m_func);
  Func::SetHasImplicitParamLoad(instrInsert->m_func);
  pIVar2 = InsertMove(&dst->super_Opnd,&src->super_Opnd,instrInsert,true);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LoadGeneratorObject(IR::Instr * instrInsert)
{
    StackSym * generatorSym = StackSym::NewImplicitParamSym(3, instrInsert->m_func);
    instrInsert->m_func->SetArgOffset(generatorSym, LowererMD::GetFormalParamOffset() * MachPtr);
    IR::SymOpnd * generatorSymOpnd = IR::SymOpnd::New(generatorSym, TyMachPtr, instrInsert->m_func);
    IR::RegOpnd * generatorRegOpnd = IR::RegOpnd::New(TyMachPtr, instrInsert->m_func);
    instrInsert->m_func->SetHasImplicitParamLoad();
    return Lowerer::InsertMove(generatorRegOpnd, generatorSymOpnd, instrInsert);
}